

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O0

WebSocketContext<false,_true> *
uWS::WebSocketContext<false,_true>::create(Loop *loop,us_socket_context_t *parentSocketContext)

{
  int iVar1;
  WebSocketContext<false,_true> *this;
  undefined4 extraout_var;
  undefined8 in_RSI;
  WebSocketContext<false,_true> *ctx;
  WebSocketContext<false,_true> *webSocketContext;
  WebSocketContextData<false> *in_stack_000000c0;
  undefined8 local_8;
  
  this = (WebSocketContext<false,_true> *)us_create_child_socket_context(0,in_RSI,0x300);
  if (this == (WebSocketContext<false,_true> *)0x0) {
    local_8 = (WebSocketContext<false,_true> *)0x0;
  }
  else {
    ctx = this;
    us_socket_context_ext(0);
    WebSocketContextData<false>::WebSocketContextData(in_stack_000000c0);
    iVar1 = init(this,(EVP_PKEY_CTX *)ctx);
    local_8 = (WebSocketContext<false,_true> *)CONCAT44(extraout_var,iVar1);
  }
  return local_8;
}

Assistant:

static WebSocketContext *create(Loop *loop, us_socket_context_t *parentSocketContext) {
        WebSocketContext *webSocketContext = (WebSocketContext *) us_create_child_socket_context(SSL, parentSocketContext, sizeof(WebSocketContextData<SSL>));
        if (!webSocketContext) {
            return nullptr;
        }

        /* Init socket context data */
        new ((WebSocketContextData<SSL> *) us_socket_context_ext(SSL, (us_socket_context_t *)webSocketContext)) WebSocketContextData<SSL>;
        return webSocketContext->init();
    }